

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeEventPoolCreate
          (ze_context_handle_t hContext,ze_event_pool_desc_t *desc,uint32_t numDevices,
          ze_device_handle_t *phDevices,ze_event_pool_handle_t *phEventPool)

{
  ze_event_pool_handle_t p_Var1;
  ze_pfnEventPoolCreate_t pfnCreate;
  ze_result_t result;
  ze_event_pool_handle_t *phEventPool_local;
  ze_device_handle_t *phDevices_local;
  uint32_t numDevices_local;
  ze_event_pool_desc_t *desc_local;
  ze_context_handle_t hContext_local;
  
  pfnCreate._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c590 == (code *)0x0) {
    p_Var1 = (ze_event_pool_handle_t)context_t::get((context_t *)&context);
    *phEventPool = p_Var1;
  }
  else {
    pfnCreate._4_4_ = (*DAT_0011c590)(hContext,desc,numDevices,phDevices,phEventPool);
  }
  return pfnCreate._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_event_pool_desc_t* desc,               ///< [in] pointer to event pool descriptor
        uint32_t numDevices,                            ///< [in][optional] number of device handles; must be 0 if `nullptr ==
                                                        ///< phDevices`
        ze_device_handle_t* phDevices,                  ///< [in][optional][range(0, numDevices)] array of device handles which
                                                        ///< have visibility to the event pool.
                                                        ///< if nullptr, then event pool is visible to all devices supported by the
                                                        ///< driver instance.
        ze_event_pool_handle_t* phEventPool             ///< [out] pointer handle of event pool object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreate = context.zeDdiTable.EventPool.pfnCreate;
        if( nullptr != pfnCreate )
        {
            result = pfnCreate( hContext, desc, numDevices, phDevices, phEventPool );
        }
        else
        {
            // generic implementation
            *phEventPool = reinterpret_cast<ze_event_pool_handle_t>( context.get() );

        }

        return result;
    }